

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint HuffmanTree_makeFromLengths2(HuffmanTree *tree)

{
  int *piVar1;
  byte bVar2;
  ushort uVar3;
  uint *puVar4;
  uint uVar5;
  uint uVar6;
  size_t i;
  uint *puVar7;
  void *__ptr;
  void *__ptr_00;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  uchar *puVar11;
  unsigned_short *puVar12;
  size_t sVar13;
  uchar uVar14;
  long lVar15;
  uint uVar16;
  size_t sVar17;
  ulong uVar18;
  byte bVar19;
  
  uVar18 = (ulong)tree->numcodes;
  puVar7 = (uint *)malloc(uVar18 * 4);
  tree->codes = puVar7;
  uVar16 = tree->maxbitlen;
  uVar9 = (ulong)(uVar16 + 1);
  sVar17 = uVar9 * 4;
  __ptr = malloc(sVar17);
  __ptr_00 = malloc(sVar17);
  if (((puVar7 == (uint *)0x0) || (__ptr == (void *)0x0)) || (__ptr_00 == (void *)0x0)) {
    free(__ptr);
  }
  else {
    for (uVar8 = 0; uVar9 != uVar8; uVar8 = uVar8 + 1) {
      *(undefined4 *)((long)__ptr_00 + uVar8 * 4) = 0;
      *(undefined4 *)((long)__ptr + uVar8 * 4) = 0;
    }
    for (uVar9 = 0; uVar18 != uVar9; uVar9 = uVar9 + 1) {
      piVar1 = (int *)((long)__ptr + (ulong)tree->lengths[uVar9] * 4);
      *piVar1 = *piVar1 + 1;
    }
    for (uVar9 = 1; uVar9 <= uVar16; uVar9 = uVar9 + 1) {
      *(int *)((long)__ptr_00 + uVar9 * 4) =
           (*(int *)((long)__ptr + uVar9 * 4 + -4) + *(int *)((long)__ptr_00 + uVar9 * 4 + -4)) * 2;
    }
    for (uVar9 = 0; uVar18 != uVar9; uVar9 = uVar9 + 1) {
      puVar4 = tree->lengths;
      uVar8 = (ulong)puVar4[uVar9];
      if (uVar8 != 0) {
        uVar16 = *(uint *)((long)__ptr_00 + uVar8 * 4);
        *(uint *)((long)__ptr_00 + uVar8 * 4) = uVar16 + 1;
        puVar7[uVar9] = uVar16;
        puVar7[uVar9] = ~(-1 << ((byte)puVar4[uVar9] & 0x1f)) & uVar16;
      }
    }
    free(__ptr);
    free(__ptr_00);
    __ptr_00 = malloc(0x800);
    if (__ptr_00 == (void *)0x0) {
      return 0x53;
    }
    for (lVar10 = 0; lVar10 != 0x800; lVar10 = lVar10 + 1) {
      *(undefined1 *)((long)__ptr_00 + lVar10) = 0;
    }
    for (uVar9 = 0; uVar18 != uVar9; uVar9 = uVar9 + 1) {
      uVar16 = tree->lengths[uVar9];
      if (9 < uVar16) {
        uVar5 = reverseBits(puVar7[uVar9] >> ((char)uVar16 - 9U & 0x1f),9);
        uVar6 = *(uint *)((long)__ptr_00 + (ulong)uVar5 * 4);
        if (uVar16 < uVar6) {
          uVar16 = uVar6;
        }
        *(uint *)((long)__ptr_00 + (ulong)uVar5 * 4) = uVar16;
      }
    }
    sVar17 = 0x200;
    for (lVar10 = 0; lVar10 != 0x200; lVar10 = lVar10 + 1) {
      uVar16 = *(uint *)((long)__ptr_00 + lVar10 * 4);
      lVar15 = 1L << ((char)uVar16 - 9U & 0x3f);
      if (uVar16 < 10) {
        lVar15 = 0;
      }
      sVar17 = sVar17 + lVar15;
    }
    puVar11 = (uchar *)malloc(sVar17);
    tree->table_len = puVar11;
    puVar12 = (unsigned_short *)malloc(sVar17 * 2);
    tree->table_value = puVar12;
    if (puVar12 != (unsigned_short *)0x0 && puVar11 != (uchar *)0x0) {
      for (sVar13 = 0; sVar17 != sVar13; sVar13 = sVar13 + 1) {
        tree->table_len[sVar13] = '\x10';
      }
      lVar10 = 0x200;
      for (lVar15 = 0; lVar15 != 0x200; lVar15 = lVar15 + 1) {
        uVar16 = *(uint *)((long)__ptr_00 + lVar15 * 4);
        if (9 < uVar16) {
          uVar14 = (uchar)uVar16;
          tree->table_len[lVar15] = uVar14;
          tree->table_value[lVar15] = (unsigned_short)lVar10;
          lVar10 = lVar10 + (1L << (uVar14 - 9 & 0x3f));
        }
      }
      free(__ptr_00);
      uVar9 = 0;
      for (uVar18 = 0; uVar18 < tree->numcodes; uVar18 = uVar18 + 1) {
        uVar16 = tree->lengths[uVar18];
        if (uVar16 != 0) {
          uVar6 = reverseBits(tree->codes[uVar18],uVar16);
          uVar9 = uVar9 + 1;
          bVar19 = (byte)uVar16;
          if (uVar16 < 10) {
            for (uVar16 = 0; uVar16 >> (9 - bVar19 & 0x1f) == 0; uVar16 = uVar16 + 1) {
              uVar5 = uVar16 << (bVar19 & 0x1f) | uVar6;
              if (tree->table_len[uVar5] != '\x10') {
                return 0x37;
              }
              tree->table_len[uVar5] = bVar19;
              tree->table_value[uVar5] = (unsigned_short)uVar18;
            }
          }
          else {
            bVar2 = tree->table_len[uVar6 & 0x1ff];
            if (bVar2 < uVar16) {
              return 0x37;
            }
            uVar3 = tree->table_value[uVar6 & 0x1ff];
            for (uVar16 = 0; uVar16 >> (bVar2 - bVar19 & 0x1f) == 0; uVar16 = uVar16 + 1) {
              uVar5 = (uVar16 << (bVar19 - 9 & 0x1f) | uVar6 >> 9) + (uint)uVar3;
              tree->table_len[uVar5] = bVar19;
              tree->table_value[uVar5] = (unsigned_short)uVar18;
            }
          }
        }
      }
      uVar18 = 0;
      if (1 < uVar9) {
        do {
          if (sVar17 == uVar18) {
            return 0;
          }
          puVar11 = tree->table_len + uVar18;
          uVar18 = uVar18 + 1;
        } while (*puVar11 != '\x10');
        return 0x37;
      }
      for (; sVar17 != uVar18; uVar18 = uVar18 + 1) {
        if (tree->table_len[uVar18] == '\x10') {
          tree->table_len[uVar18] = (0x1ff < uVar18) * '\t' + '\x01';
          tree->table_value[uVar18] = 0xffff;
        }
      }
      return 0;
    }
  }
  free(__ptr_00);
  return 0x53;
}

Assistant:

static unsigned HuffmanTree_makeFromLengths2(HuffmanTree* tree) {
  unsigned* blcount;
  unsigned* nextcode;
  unsigned error = 0;
  unsigned bits, n;

  tree->codes = (unsigned*)lodepng_malloc(tree->numcodes * sizeof(unsigned));
  blcount = (unsigned*)lodepng_malloc((tree->maxbitlen + 1) * sizeof(unsigned));
  nextcode = (unsigned*)lodepng_malloc((tree->maxbitlen + 1) * sizeof(unsigned));
  if(!tree->codes || !blcount || !nextcode) error = 83; /*alloc fail*/

  if(!error) {
    for(n = 0; n != tree->maxbitlen + 1; n++) blcount[n] = nextcode[n] = 0;
    /*step 1: count number of instances of each code length*/
    for(bits = 0; bits != tree->numcodes; ++bits) ++blcount[tree->lengths[bits]];
    /*step 2: generate the nextcode values*/
    for(bits = 1; bits <= tree->maxbitlen; ++bits) {
      nextcode[bits] = (nextcode[bits - 1] + blcount[bits - 1]) << 1u;
    }
    /*step 3: generate all the codes*/
    for(n = 0; n != tree->numcodes; ++n) {
      if(tree->lengths[n] != 0) {
        tree->codes[n] = nextcode[tree->lengths[n]]++;
        /*remove superfluous bits from the code*/
        tree->codes[n] &= ((1u << tree->lengths[n]) - 1u);
      }
    }
  }

  lodepng_free(blcount);
  lodepng_free(nextcode);

  if(!error) error = HuffmanTree_makeTable(tree);
  return error;
}